

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedbackOverflowQueryBaseTest::supportsConditionalRenderInverted
          (TransformFeedbackOverflowQueryBaseTest *this)

{
  bool bVar1;
  ContextInfo *this_00;
  RenderContext *pRVar2;
  bool local_19;
  ApiType local_18;
  ContextType local_14;
  TransformFeedbackOverflowQueryBaseTest *local_10;
  TransformFeedbackOverflowQueryBaseTest *this_local;
  
  local_10 = this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_conditional_render_inverted");
  local_19 = true;
  if (!bVar1) {
    pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    local_14.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
    glu::ApiType::ApiType(&local_18,4,5,PROFILE_CORE);
    local_19 = glu::contextSupports(local_14,local_18);
  }
  return local_19;
}

Assistant:

bool supportsConditionalRenderInverted()
	{
		return (m_context.getContextInfo().isExtensionSupported("GL_ARB_conditional_render_inverted") ||
				glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType(4, 5, glu::PROFILE_CORE)));
	}